

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_av1d_vdpu.c
# Opt level: O0

MPP_RET vdpu_av1d_deinit(void *hal)

{
  void *hal_local;
  
  hal_av1d_release_res(hal);
  return MPP_OK;
}

Assistant:

MPP_RET vdpu_av1d_deinit(void *hal)
{
    hal_av1d_release_res(hal);

    return MPP_OK;
}